

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

int32_t kfold_intop(int32_t k1,int32_t k2,IROp op)

{
  byte bVar1;
  IROp local_28;
  IROp local_24;
  IROp op_local;
  int32_t k2_local;
  int32_t k1_local;
  
  bVar1 = (byte)k2;
  switch(op) {
  case IR_BAND:
    op_local = k2 & k1;
    break;
  case IR_BOR:
    op_local = k2 | k1;
    break;
  case IR_BXOR:
    op_local = k2 ^ k1;
    break;
  case IR_BSHL:
    op_local = k1 << (bVar1 & 0x1f);
    break;
  case IR_BSHR:
    op_local = (uint)k1 >> (bVar1 & 0x1f);
    break;
  case IR_BSAR:
    op_local = k1 >> (bVar1 & 0x1f);
    break;
  case IR_BROL:
    op_local = k1 << (bVar1 & 0x1f) | (uint)k1 >> (-(bVar1 & 0x1f) & 0x1f);
    break;
  case IR_BROR:
    op_local = k1 << (-(bVar1 & 0x1f) & 0x1f) | (uint)k1 >> (bVar1 & 0x1f);
    break;
  case IR_ADD:
    op_local = k2 + k1;
    break;
  case IR_SUB:
    op_local = k1 - k2;
    break;
  case IR_MUL:
    op_local = k2 * k1;
    break;
  default:
    op_local = k1;
    break;
  case IR_MOD:
    op_local = lj_vm_modi(k1,k2);
    break;
  case IR_NEG:
    op_local = -k1;
    break;
  case IR_MIN:
    local_24 = k2;
    if (k1 < k2) {
      local_24 = k1;
    }
    op_local = local_24;
    break;
  case IR_MAX:
    local_28 = k2;
    if (k2 < k1) {
      local_28 = k1;
    }
    op_local = local_28;
  }
  return op_local;
}

Assistant:

static int32_t kfold_intop(int32_t k1, int32_t k2, IROp op)
{
  switch (op) {
  case IR_ADD: k1 += k2; break;
  case IR_SUB: k1 -= k2; break;
  case IR_MUL: k1 *= k2; break;
  case IR_MOD: k1 = lj_vm_modi(k1, k2); break;
  case IR_NEG: k1 = -k1; break;
  case IR_BAND: k1 &= k2; break;
  case IR_BOR: k1 |= k2; break;
  case IR_BXOR: k1 ^= k2; break;
  case IR_BSHL: k1 <<= (k2 & 31); break;
  case IR_BSHR: k1 = (int32_t)((uint32_t)k1 >> (k2 & 31)); break;
  case IR_BSAR: k1 >>= (k2 & 31); break;
  case IR_BROL: k1 = (int32_t)lj_rol((uint32_t)k1, (k2 & 31)); break;
  case IR_BROR: k1 = (int32_t)lj_ror((uint32_t)k1, (k2 & 31)); break;
  case IR_MIN: k1 = k1 < k2 ? k1 : k2; break;
  case IR_MAX: k1 = k1 > k2 ? k1 : k2; break;
  default: lj_assertX(0, "bad IR op %d", op); break;
  }
  return k1;
}